

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall
re2::Regexp::ParseState::ParseCharClass
          (ParseState *this,StringPiece *s,Regexp **out_re,RegexpStatus *status)

{
  bool bVar1;
  bool bVar2;
  ParseFlags b;
  ParseFlags PVar3;
  int iVar4;
  size_type sVar5;
  const_reference pcVar6;
  StringPiece *s_00;
  const_pointer pcVar7;
  RegexpStatus *in_RCX;
  undefined8 *in_RDX;
  StringPiece *in_RSI;
  CharClassBuilder *in_RDI;
  Rune in_stack_00000020;
  Rune in_stack_00000024;
  CharClassBuilder *in_stack_00000028;
  RuneRange rr;
  UGroup *g;
  int n;
  Rune r;
  StringPiece t;
  bool first;
  Regexp *re;
  bool negated;
  StringPiece whole_class;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  ParseStatus in_stack_ffffffffffffff18;
  ParseStatus in_stack_ffffffffffffff1c;
  CharClassBuilder *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff28;
  byte in_stack_ffffffffffffff2e;
  byte bVar8;
  ParseFlags a;
  RegexpStatus *in_stack_ffffffffffffff50;
  Rune in_stack_ffffffffffffff60;
  ParseFlags in_stack_ffffffffffffff64;
  ParseState *in_stack_ffffffffffffff68;
  StringPiece local_90;
  ParseFlags in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  UGroup *in_stack_ffffffffffffff88;
  CharClassBuilder *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar9;
  undefined4 in_stack_ffffffffffffff9c;
  ParseFlags in_stack_ffffffffffffffa4;
  StringPiece local_48;
  const_pointer local_38;
  CharClassBuilder *this_00;
  
  local_38 = in_RSI->data_;
  this_00 = (CharClassBuilder *)in_RSI->size_;
  sVar5 = StringPiece::size(in_RSI);
  if ((sVar5 == 0) || (pcVar6 = StringPiece::operator[](in_RSI,0), *pcVar6 != '[')) {
    RegexpStatus::set_code(in_RCX,kRegexpInternalError);
    StringPiece::StringPiece(&local_48);
    RegexpStatus::set_error_arg(in_RCX,&local_48);
    return false;
  }
  bVar1 = false;
  s_00 = (StringPiece *)operator_new(0x28);
  a = in_RDI->upper_;
  b = operator~(FoldCase);
  operator&(a,b);
  Regexp((Regexp *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
         (RegexpOp)((ulong)in_stack_ffffffffffffff08 >> 0x20),(ParseFlags)in_stack_ffffffffffffff08)
  ;
  pcVar7 = (const_pointer)operator_new(0x40);
  CharClassBuilder::CharClassBuilder
            ((CharClassBuilder *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  s_00[2].data_ = pcVar7;
  StringPiece::remove_prefix(in_RSI,1);
  sVar5 = StringPiece::size(in_RSI);
  if ((sVar5 != 0) && (pcVar6 = StringPiece::operator[](in_RSI,0), *pcVar6 == '^')) {
    StringPiece::remove_prefix(in_RSI,1);
    bVar1 = true;
    PVar3 = operator&(in_RDI->upper_,ClassNL);
    if ((PVar3 == NoParseFlags) ||
       (PVar3 = operator&(in_RDI->upper_,NeverNL), PVar3 != NoParseFlags)) {
      CharClassBuilder::AddRange(in_stack_00000028,in_stack_00000024,in_stack_00000020);
    }
  }
  uVar9 = CONCAT13(1,(int3)in_stack_ffffffffffffff98);
LAB_0024f987:
  sVar5 = StringPiece::size(in_RSI);
  bVar8 = 0;
  if (sVar5 != 0) {
    pcVar6 = StringPiece::operator[](in_RSI,0);
    in_stack_ffffffffffffff2e = 1;
    bVar8 = in_stack_ffffffffffffff2e;
    if (*pcVar6 == ']') {
      in_stack_ffffffffffffff2e = (byte)(uVar9 >> 0x18);
      bVar8 = in_stack_ffffffffffffff2e;
    }
  }
  if ((bVar8 & 1) == 0) {
    sVar5 = StringPiece::size(in_RSI);
    if (sVar5 == 0) {
      RegexpStatus::set_code(in_RCX,kRegexpMissingBracket);
      RegexpStatus::set_error_arg(in_RCX,(StringPiece *)&local_38);
      Decref((Regexp *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      return false;
    }
    StringPiece::remove_prefix(in_RSI,1);
    if (bVar1) {
      CharClassBuilder::Negate(this_00);
    }
    *in_RDX = s_00;
    return true;
  }
  pcVar6 = StringPiece::operator[](in_RSI,0);
  if ((((*pcVar6 == '-') && ((uVar9 & 0x1000000) == 0)) &&
      (PVar3 = operator&(in_RDI->upper_,PerlX), PVar3 == NoParseFlags)) &&
     ((sVar5 = StringPiece::size(in_RSI), sVar5 == 1 ||
      (pcVar6 = StringPiece::operator[](in_RSI,1), *pcVar6 != ']')))) {
    StringPiece::remove_prefix((StringPiece *)&stack0xffffffffffffff88,1);
    iVar4 = StringPieceToRune((Rune *)in_RDI,(StringPiece *)in_stack_ffffffffffffff50,
                              (RegexpStatus *)CONCAT44(b,a));
    if (iVar4 < 0) {
      Decref((Regexp *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      return false;
    }
    RegexpStatus::set_code(in_RCX,kRegexpBadCharRange);
    pcVar7 = StringPiece::data(in_RSI);
    StringPiece::StringPiece(&local_90,pcVar7,(long)(iVar4 + 1));
    RegexpStatus::set_error_arg(in_RCX,&local_90);
    Decref((Regexp *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    return false;
  }
  uVar9 = uVar9 & 0xffffff;
  sVar5 = StringPiece::size(in_RSI);
  if ((2 < sVar5) &&
     ((pcVar6 = StringPiece::operator[](in_RSI,0), *pcVar6 == '[' &&
      (pcVar6 = StringPiece::operator[](in_RSI,1), *pcVar6 == ':')))) goto code_r0x0024fb8a;
  goto LAB_0024fbf7;
code_r0x0024fb8a:
  in_stack_ffffffffffffff1c =
       ParseCCName((StringPiece *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_RDI,
                   in_stack_ffffffffffffff50);
  if (in_stack_ffffffffffffff1c != kParseOk) {
    if (in_stack_ffffffffffffff1c == kParseError) {
      Decref((Regexp *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      return false;
    }
LAB_0024fbf7:
    sVar5 = StringPiece::size(in_RSI);
    PVar3 = in_stack_ffffffffffffff64;
    if (((2 < sVar5) &&
        (pcVar6 = StringPiece::operator[](in_RSI,0), PVar3 = in_stack_ffffffffffffff64,
        *pcVar6 == '\\')) &&
       ((pcVar6 = StringPiece::operator[](in_RSI,1), *pcVar6 == 'p' ||
        (pcVar6 = StringPiece::operator[](in_RSI,1), PVar3 = in_stack_ffffffffffffff64,
        *pcVar6 == 'P')))) {
      in_stack_ffffffffffffff18 =
           ParseUnicodeGroup(s_00,in_stack_ffffffffffffffa4,
                             (CharClassBuilder *)CONCAT44(in_stack_ffffffffffffff9c,uVar9),
                             (RegexpStatus *)in_stack_ffffffffffffff90);
      if (in_stack_ffffffffffffff18 == kParseOk) goto LAB_0024f987;
      PVar3 = in_stack_ffffffffffffff64;
      if (in_stack_ffffffffffffff18 == kParseError) {
        Decref((Regexp *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        return false;
      }
    }
    in_stack_ffffffffffffff68 =
         (ParseState *)
         MaybeParsePerlCCEscape
                   ((StringPiece *)
                    CONCAT17(bVar8,CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),
                    (ParseFlags)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    if (in_stack_ffffffffffffff68 == (ParseState *)0x0) {
      RuneRange::RuneRange((RuneRange *)&stack0xffffffffffffff60);
      bVar2 = ParseCCRange(in_stack_ffffffffffffff68,
                           (StringPiece *)CONCAT44(PVar3,in_stack_ffffffffffffff60),
                           (RuneRange *)in_RDI,(StringPiece *)in_stack_ffffffffffffff50,
                           (RegexpStatus *)CONCAT44(b,a));
      if (!bVar2) {
        Decref((Regexp *)CONCAT44(PVar3,in_stack_ffffffffffffff60));
        return false;
      }
      in_stack_ffffffffffffff64 = PVar3;
      operator|(in_RDI->upper_,ClassNL);
      CharClassBuilder::AddRangeFlags
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,PVar3
                );
    }
    else {
      AddUGroup(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff64 = PVar3;
    }
  }
  goto LAB_0024f987;
}

Assistant:

bool Regexp::ParseState::ParseCharClass(StringPiece* s,
                                        Regexp** out_re,
                                        RegexpStatus* status) {
  StringPiece whole_class = *s;
  if (s->size() == 0 || (*s)[0] != '[') {
    // Caller checked this.
    status->set_code(kRegexpInternalError);
    status->set_error_arg(StringPiece());
    return false;
  }
  bool negated = false;
  Regexp* re = new Regexp(kRegexpCharClass, flags_ & ~FoldCase);
  re->ccb_ = new CharClassBuilder;
  s->remove_prefix(1);  // '['
  if (s->size() > 0 && (*s)[0] == '^') {
    s->remove_prefix(1);  // '^'
    negated = true;
    if (!(flags_ & ClassNL) || (flags_ & NeverNL)) {
      // If NL can't match implicitly, then pretend
      // negated classes include a leading \n.
      re->ccb_->AddRange('\n', '\n');
    }
  }
  bool first = true;  // ] is okay as first char in class
  while (s->size() > 0 && ((*s)[0] != ']' || first)) {
    // - is only okay unescaped as first or last in class.
    // Except that Perl allows - anywhere.
    if ((*s)[0] == '-' && !first && !(flags_&PerlX) &&
        (s->size() == 1 || (*s)[1] != ']')) {
      StringPiece t = *s;
      t.remove_prefix(1);  // '-'
      Rune r;
      int n = StringPieceToRune(&r, &t, status);
      if (n < 0) {
        re->Decref();
        return false;
      }
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(StringPiece(s->data(), 1+n));
      re->Decref();
      return false;
    }
    first = false;

    // Look for [:alnum:] etc.
    if (s->size() > 2 && (*s)[0] == '[' && (*s)[1] == ':') {
      switch (ParseCCName(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Unicode character group like \p{Han}
    if (s->size() > 2 &&
        (*s)[0] == '\\' &&
        ((*s)[1] == 'p' || (*s)[1] == 'P')) {
      switch (ParseUnicodeGroup(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Perl character class symbols (extension).
    const UGroup *g = MaybeParsePerlCCEscape(s, flags_);
    if (g != NULL) {
      AddUGroup(re->ccb_, g, g->sign, flags_);
      continue;
    }

    // Otherwise assume single character or simple range.
    RuneRange rr;
    if (!ParseCCRange(s, &rr, whole_class, status)) {
      re->Decref();
      return false;
    }
    // AddRangeFlags is usually called in response to a class like
    // \p{Foo} or [[:foo:]]; for those, it filters \n out unless
    // Regexp::ClassNL is set.  In an explicit range or singleton
    // like we just parsed, we do not filter \n out, so set ClassNL
    // in the flags.
    re->ccb_->AddRangeFlags(rr.lo, rr.hi, flags_ | Regexp::ClassNL);
  }
  if (s->size() == 0) {
    status->set_code(kRegexpMissingBracket);
    status->set_error_arg(whole_class);
    re->Decref();
    return false;
  }
  s->remove_prefix(1);  // ']'

  if (negated)
    re->ccb_->Negate();

  *out_re = re;
  return true;
}